

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_ManSuppSize_rec(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  Cof_Obj_t CVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (pObj->Value != p->nTravIds) {
    pObj->Value = p->nTravIds;
    CVar1 = *pObj;
    iVar3 = 1;
    if (((undefined1  [24])CVar1 & (undefined1  [24])0xf1) != (undefined1  [24])0x1) {
      if ((((undefined1  [24])CVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) ||
         (((undefined1  [24])CVar1 & (undefined1  [24])0xf0) == (undefined1  [24])0x0)) {
        __assert_fail("Cof_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCof.c"
                      ,0x148,"int Cof_ManSuppSize_rec(Cof_Man_t *, Cof_Obj_t *)");
      }
      uVar4 = 0;
      iVar3 = 0;
      do {
        iVar2 = Cof_ManSuppSize_rec(p,(Cof_Obj_t *)
                                      ((long)pObj +
                                      (ulong)(*(uint *)(&pObj[1].field_0x0 + uVar4 * 4) & 0x7fffffff
                                             ) * -4));
        iVar3 = iVar3 + iVar2;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (*(uint *)pObj >> 4 & 0xf));
    }
  }
  return iVar3;
}

Assistant:

int Cof_ManSuppSize_rec( Cof_Man_t * p, Cof_Obj_t * pObj )
{
    Cof_Obj_t * pNext;
    unsigned i, Counter = 0;
    if ( Cof_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Cof_ObjSetTravIdCurrent(p, pObj);
    if ( Cof_ObjIsCi(pObj) )
        return 1;
    assert( Cof_ObjIsNode(pObj) );
    Cof_ObjForEachFanin( pObj, pNext, i )
        Counter += Cof_ManSuppSize_rec( p, pNext );
    return Counter;
}